

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_read_op(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  int iVar1;
  sexp psVar2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp shares;
  sexp res;
  undefined1 *local_48;
  sexp_conflict *shares_00;
  sexp in_00;
  sexp in_stack_ffffffffffffffd0;
  sexp local_8;
  
  in_00 = (sexp)&DAT_0000043e;
  memset(&local_48,0,0x10);
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 0x10)) {
    iVar1 = sexp_maybe_block_port(res,shares,__sexp_gc_preserver1.next._4_4_);
    if (iVar1 == 0) {
      local_48 = &stack0xffffffffffffffc8;
      shares_00 = *(sexp_conflict **)(in_RDI + 0x6080);
      *(undefined1 ***)(in_RDI + 0x6080) = &local_48;
      local_8 = sexp_read_one(in_stack_ffffffffffffffd0,in_00,shares_00);
      if ((((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) && (((ulong)in_00 & 3) == 0)) &&
         (in_00->tag == 10)) {
        psVar2 = sexp_fill_reader_labels(in_RSI,in_RDX,in_RCX,(int)((ulong)local_8 >> 0x20));
        local_8 = sexp_fill_reader_labels(in_RSI,in_RDX,in_RCX,(int)((ulong)psVar2 >> 0x20));
      }
      sexp_maybe_unblock_port(local_8,in_00);
      *(sexp_conflict **)(in_RDI + 0x6080) = shares_00;
    }
    else {
      local_8 = *(sexp *)(*(long *)(in_RDI + 0x28) + 0x140);
    }
  }
  else {
    local_8 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_stack_ffffffffffffffd0,in_00);
  }
  return local_8;
}

Assistant:

sexp sexp_read_op (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp res;
  sexp_gc_var1(shares);
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  sexp_check_block_port(ctx, in, 0);
  sexp_gc_preserve1(ctx, shares);
  res = sexp_read_one(ctx, in, &shares);
#if SEXP_USE_READER_LABELS
  if (!sexp_exceptionp(res) && sexp_vectorp(shares)) {
    res = sexp_fill_reader_labels(ctx, res, shares, 1);  /* mark=1 */
    res = sexp_fill_reader_labels(ctx, res, shares, 0);  /* mark=0 */
  }
#endif
  sexp_maybe_unblock_port(ctx, in);
  sexp_gc_release1(ctx);
  return res;
}